

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O2

void __thiscall
PersistentStorageJsonTestSuite_GetRegistrarNotEmpty_Test::
~PersistentStorageJsonTestSuite_GetRegistrarNotEmpty_Test
          (PersistentStorageJsonTestSuite_GetRegistrarNotEmpty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetRegistrarNotEmpty)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    RegistrarId newId;

    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.1", 1, {"dom1"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.2", 2, {"dom2"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Registrar{EMPTY_ID, "0.0.0.3", 3, {"dom3"}}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    Registrar returnValue;

    EXPECT_TRUE(psj.Get(RegistrarId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(RegistrarId(1), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 1);
    EXPECT_TRUE(returnValue.mAddr == "0.0.0.2");
    EXPECT_TRUE(returnValue.mPort == 2);
    EXPECT_TRUE(returnValue.mDomains == std::vector<std::string>{"dom2"});

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}